

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O3

void __thiscall bdQueryManager::clearQuery(bdQueryManager *this,bdNodeId *rmId)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  int iVar6;
  _Self __tmp;
  
  p_Var5 = (this->mLocalQueries).super__List_base<bdQuery_*,_std::allocator<bdQuery_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)&this->mLocalQueries) {
    iVar6 = operator==((bdNodeId *)p_Var5[1]._M_next,rmId);
    if (iVar6 == 0) {
      p_Var5 = p_Var5->_M_next;
    }
    else {
      p_Var2 = p_Var5->_M_next;
      p_Var3 = p_Var5[1]._M_next;
      psVar1 = &(this->mLocalQueries).super__List_base<bdQuery_*,_std::allocator<bdQuery_*>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x18);
      if (p_Var3 != (_List_node_base *)0x0) {
        p_Var5 = p_Var3[0xd]._M_next;
        while (p_Var5 != p_Var3 + 0xd) {
          p_Var4 = p_Var5->_M_next;
          operator_delete(p_Var5,0x58);
          p_Var5 = p_Var4;
        }
        p_Var5 = *(_List_node_base **)((long)(p_Var3 + 0xb) + 8);
        while (p_Var5 != (_List_node_base *)((long)(p_Var3 + 0xb) + 8U)) {
          p_Var4 = p_Var5->_M_next;
          operator_delete(p_Var5,0x58);
          p_Var5 = p_Var4;
        }
        std::
        _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
        ::~_Rb_tree((_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                     *)((long)(p_Var3 + 7) + 8));
        std::
        _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
        ::~_Rb_tree((_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                     *)((long)(p_Var3 + 4) + 8));
      }
      operator_delete(p_Var3,0xf8);
      p_Var5 = p_Var2;
    }
  }
  return;
}

Assistant:

void bdQueryManager::clearQuery(const bdNodeId *rmId) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end();) {
		if ((*it)->mId == *rmId) {
			bdQuery *query = (*it);
			it = mLocalQueries.erase(it);
			delete query;
		} else
			it++;
	}
}